

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O1

char * __thiscall Potassco::ProgramOptions::Value::implicit(Value *this)

{
  byte_t bVar1;
  char *pcVar2;
  char *pcVar3;
  
  if ((this->flags_ & 1) == 0) {
    return (char *)0x0;
  }
  bVar1 = this->descFlag_;
  if ((bVar1 == '\b') || (bVar1 == '\x04')) {
    if (bVar1 != '\x04') {
      this = (Value *)(this->desc_).value;
    }
    pcVar3 = (this->desc_).value;
  }
  else {
    pcVar3 = (char *)0x0;
  }
  pcVar2 = "1";
  if (pcVar3 != (char *)0x0) {
    pcVar2 = pcVar3;
  }
  return pcVar2;
}

Assistant:

bool hasProperty(Property f)const { return (flags_ & byte_t(f)) == f; }